

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ForkBranchBase::releaseHub(ForkBranchBase *this,ExceptionOrValue *output)

{
  undefined8 this_00;
  NullableValue<kj::Exception> *other;
  Exception *pEVar1;
  anon_class_8_1_8991fb9c *in_RDX;
  Exception *exception;
  undefined1 local_350 [416];
  undefined1 local_1b0 [8];
  NullableValue<kj::Exception> _exception2536;
  ExceptionOrValue *output_local;
  ForkBranchBase *this_local;
  
  local_350._0_8_ = this;
  _exception2536.field_1.value.details.builder.disposer = (ArrayDisposer *)output;
  runCatchingExceptions<kj::_::ForkBranchBase::releaseHub(kj::_::ExceptionOrValue&)::__0>
            ((Maybe<kj::Exception> *)(local_350 + 8),(kj *)local_350,in_RDX);
  other = readMaybe<kj::Exception>((Maybe<kj::Exception> *)(local_350 + 8));
  NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1b0,other);
  Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_350 + 8));
  pEVar1 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1b0);
  if (pEVar1 != (Exception *)0x0) {
    pEVar1 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_1b0);
    this_00 = _exception2536.field_1.value.details.builder.disposer;
    pEVar1 = mv<kj::Exception>(pEVar1);
    ExceptionOrValue::addException((ExceptionOrValue *)this_00,pEVar1);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1b0);
  return;
}

Assistant:

void ForkBranchBase::releaseHub(ExceptionOrValue& output) {
  KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
    hub = nullptr;
  })) {
    output.addException(kj::mv(exception));
  }
}